

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_createAnonymousValueMetatype
          (sysbvm_context_t *context,sysbvm_tuple_t supertype,size_t minimumSlotCount)

{
  sysbvm_object_tuple_t *psVar1;
  ulong uVar2;
  sysbvm_tuple_t sVar3;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).valueMetatypeType,0x1e);
  psVar1[2].header.field_0.typePointer = supertype;
  psVar1[4].field_1.pointers[0] = 0x1b;
  if (supertype != 0) {
    if ((supertype & 0xf) == 0) {
      uVar2 = *(ulong *)(supertype + 0x58);
      if (uVar2 == 0 || (uVar2 & 0xf) != 0) {
        uVar2 = (long)uVar2 >> 4;
      }
      else {
        uVar2 = *(ulong *)(uVar2 + 0x10);
      }
    }
    else {
      uVar2 = 0;
    }
    if (minimumSlotCount < uVar2) {
      minimumSlotCount = uVar2;
    }
  }
  if (minimumSlotCount + 0x800000000000000 >> 0x3c == 0) {
    sVar3 = minimumSlotCount << 4 | 0xb;
  }
  else {
    sVar3 = sysbvm_tuple_uint64_encodeBig(context,minimumSlotCount);
  }
  psVar1[3].field_1.pointers[0] = sVar3;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousValueMetatype(sysbvm_context_t *context, sysbvm_tuple_t supertype, size_t minimumSlotCount)
{
    sysbvm_valueMetatype_t* result = (sysbvm_valueMetatype_t*)sysbvm_context_allocatePointerTuple(context, context->roots.valueMetatypeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_valueMetatype_t));
    result->super.super.supertype = supertype;
    result->super.super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS);

    size_t slotCount = minimumSlotCount;
    if(supertype)
    {
        size_t superTypeSlotCount = sysbvm_type_getTotalSlotCount(supertype);
        if(superTypeSlotCount > slotCount)
            slotCount = superTypeSlotCount;
    }
    
    result->super.super.totalSlotCount = sysbvm_tuple_size_encode(context, slotCount);
    result->super.super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}